

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

void highsOpenLogFile(HighsLogOptions *log_options,
                     vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                     string *log_file)

{
  OptionRecord *pOVar1;
  pointer pcVar2;
  int iVar3;
  FILE *pFVar4;
  HighsInt index;
  int local_64;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"log_file","");
  getOptionIndex(log_options,&local_60,option_records,&local_64);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((FILE *)log_options->log_stream != (FILE *)0x0) {
    fflush((FILE *)log_options->log_stream);
    fclose((FILE *)log_options->log_stream);
  }
  iVar3 = std::__cxx11::string::compare((char *)log_file);
  if (iVar3 == 0) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    pFVar4 = fopen((log_file->_M_dataplus)._M_p,"a");
  }
  log_options->log_stream = (FILE *)pFVar4;
  pOVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
           _M_impl.super__Vector_impl_data._M_start[local_64];
  pcVar2 = (log_file->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + log_file->_M_string_length);
  std::__cxx11::string::_M_assign((string *)pOVar1[1]._vptr_OptionRecord);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void highsOpenLogFile(HighsLogOptions& log_options,
                      std::vector<OptionRecord*>& option_records,
                      const std::string log_file) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(log_options, "log_file", option_records, index);
  assert(status == OptionStatus::kOk);
  if (log_options.log_stream != NULL) {
    // Current log file stream is not null, so flush and close it
    fflush(log_options.log_stream);
    fclose(log_options.log_stream);
  }
  if (log_file.compare("")) {
    // New log file name is not empty, so open it, appending if
    // possible
    log_options.log_stream = fopen(log_file.c_str(), "a");
  } else {
    // New log file name is empty, so set the stream to null
    log_options.log_stream = NULL;
  }
  OptionRecordString& option = *(OptionRecordString*)option_records[index];
  option.assignvalue(log_file);
}